

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

void set_artifact_intrinsic(obj *otmp,boolean on,long wp_mask,boolean side_effects)

{
  byte *pbVar1;
  ulong uVar2;
  bool bVar3;
  boolean bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  uchar uVar10;
  uint uVar11;
  obj *poVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  prop *local_50;
  artifact *local_40;
  
  uVar11 = (uint)wp_mask;
  if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
    if (otmp->oprops == 0) {
      return;
    }
    bVar14 = true;
    local_40 = (artifact *)0x0;
LAB_0014ab20:
    uVar8 = (ulong)(wp_mask == 0x1000);
    bVar16 = on != '\0';
    goto LAB_0014ac6e;
  }
  local_40 = artilist + otmp->oartifact;
  uVar8 = (ulong)(wp_mask == 0x1000);
  uVar10 = (&local_40->defn)[uVar8].adtyp;
  bVar14 = false;
  bVar16 = false;
  switch(uVar10) {
  case '\x01':
    local_50 = u.uprops + 0x2c;
    uVar10 = '\x01';
    bVar16 = true;
    goto LAB_0014aba0;
  case '\x02':
    local_50 = u.uprops + 1;
    goto LAB_0014aba0;
  case '\x03':
    local_50 = u.uprops + 2;
    uVar10 = '\x03';
    break;
  default:
    goto LAB_0014ab20;
  case '\x05':
    local_50 = u.uprops + 4;
    uVar10 = '\x05';
    break;
  case '\x06':
    local_50 = u.uprops + 5;
    uVar10 = '\x06';
    break;
  case '\a':
    local_50 = u.uprops + 6;
    uVar10 = '\a';
  }
  bVar16 = false;
LAB_0014aba0:
  poVar12 = invent;
  if (on == '\0' && wp_mask == 0x1000) {
    for (; poVar12 != (obj *)0x0; poVar12 = poVar12->nobj) {
      if (((poVar12 != otmp) && ((long)poVar12->oartifact != 0)) &&
         ((uVar10 == artilist[poVar12->oartifact].cary.adtyp ||
          ((bVar16 && (bVar4 = is_quest_artifact(poVar12), bVar4 != '\0')))))) {
        uVar8 = 1;
        goto LAB_0014ac69;
      }
    }
LAB_0014ac53:
    local_50->extrinsic = local_50->extrinsic & ~uVar11;
LAB_0014ac69:
    bVar16 = false;
    bVar14 = false;
LAB_0014ac6e:
    bVar4 = is_quest_artifact(otmp);
    cVar9 = (char)uVar8;
    if ((cVar9 != '\0') && (bVar4 != '\0')) {
      poVar12 = invent;
      if (bVar16 == false) {
        for (; poVar12 != (obj *)0x0; poVar12 = poVar12->nobj) {
          if (((poVar12 != otmp) && ((long)poVar12->oartifact != 0)) &&
             (artilist[poVar12->oartifact].cary.adtyp == '\x01')) goto LAB_0014ace0;
        }
        u.uprops[0x2c].extrinsic._1_1_ = u.uprops[0x2c].extrinsic._1_1_ & 0xef;
      }
      else {
        u.uprops[0x2c].extrinsic._1_1_ = u.uprops[0x2c].extrinsic._1_1_ | 0x10;
        bVar16 = true;
      }
    }
LAB_0014ace0:
    if (!bVar14) goto LAB_0014adec;
    if (wp_mask != 0x100) {
      if (wp_mask != 0x400) {
        return;
      }
      if ((bVar16 & u.twoweap == '\0') != 0) {
        return;
      }
    }
    if (otmp->oclass == '\x02') {
      cVar5 = objects[otmp->otyp].oc_subtyp;
      if ((byte)(cVar5 + 0x18U) < 3) {
        return;
      }
    }
    else {
      if (otmp->oclass != '\x06') {
        return;
      }
      cVar5 = objects[otmp->otyp].oc_subtyp;
      if (cVar5 == '\0') {
        return;
      }
    }
    if ((byte)(cVar5 + 0x1bU) < 3) {
      return;
    }
    uVar2 = otmp->oprops;
    uVar6 = (uint)uVar2;
    uVar8 = (ulong)((uint)(uVar2 >> 8) & 0x20 |
                   (uint)(uVar2 >> 3) & 0x200 | (uVar6 & 0x10) * 0x400000 + (uVar6 & 0x400) * 4);
    bVar13 = (uVar6 >> 0x13 & 1) == 0;
    bVar14 = (uVar6 >> 0xe & 1) == 0;
    bVar17 = -1 < (short)uVar2;
    bVar15 = (uVar6 >> 0x12 & 1) == 0;
    bVar3 = true;
  }
  else {
    if (on == '\0') goto LAB_0014ac53;
    local_50->extrinsic = local_50->extrinsic | uVar11;
    bVar4 = is_quest_artifact(otmp);
    bVar16 = true;
    if ((wp_mask == 0x1000) && (bVar4 != '\0')) {
      u.uprops[0x2c].extrinsic._1_1_ = u.uprops[0x2c].extrinsic._1_1_ | 0x10;
    }
LAB_0014adec:
    cVar9 = (char)uVar8;
    uVar8 = (&local_40->spfx)[uVar8];
    bVar14 = true;
    bVar3 = false;
    bVar17 = true;
    bVar15 = true;
    bVar13 = true;
  }
  if (((bVar16 == false) && (cVar9 != '\0')) && (poVar12 = invent, uVar8 != 0)) {
    for (; poVar12 != (obj *)0x0; poVar12 = poVar12->nobj) {
      if ((poVar12 != otmp) && ((long)poVar12->oartifact != 0)) {
        uVar8 = uVar8 & ~artilist[poVar12->oartifact].cspfx;
      }
    }
  }
  uVar6 = (uint)uVar8;
  if ((uVar6 >> 9 & 1) != 0) {
    uVar7 = u.uprops[0xb].extrinsic | uVar11;
    u.uprops[0xb].extrinsic = ~uVar11 & u.uprops[0xb].extrinsic;
    if (bVar16 != false) {
      u.uprops[0xb].extrinsic = uVar7;
    }
  }
  if ((uVar6 >> 0xb & 1) != 0) {
    make_hallucinated((ulong)(bVar16 ^ 1),side_effects,wp_mask);
  }
  if ((uVar6 >> 0xc & 1) != 0) {
    uVar7 = ~uVar11 & u.uprops[0x19].extrinsic;
    u.uprops[0x19].extrinsic = u.uprops[0x19].extrinsic | uVar11;
    if (bVar16 == false) {
      u.uprops[0x19].extrinsic = uVar7;
    }
    see_monsters();
  }
  if (bVar14) {
LAB_0014aede:
    if (!bVar17) {
      if (bVar16 == false) {
        bVar16 = false;
        u.uprops[0x25].extrinsic = u.uprops[0x25].extrinsic & ~uVar11;
        if (u.uprops[0x25].extrinsic == 0) {
          u.uprops[0x25].extrinsic = 0;
          u.uprops[0x25].intrinsic = 0;
        }
      }
      else {
LAB_0014af84:
        if ((u.uprops[0x25].extrinsic == 0) && (u.uprops[0x25].intrinsic < 0x1000000)) {
          uVar7 = mt_random();
          incr_itimeout(&u.uprops[0x25].intrinsic,(ulong)(uVar7 % 0x14 + 1));
        }
        u.uprops[0x25].extrinsic = uVar11 | u.uprops[0x25].extrinsic;
        bVar16 = true;
      }
    }
  }
  else {
    if (bVar16 == false) {
      u.uprops[0x13].extrinsic = ~uVar11 & u.uprops[0x13].extrinsic;
      if ((((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
          (u.uprops[0x13].intrinsic == 0)) &&
         ((u.uprops[0x13].blocked == 0 &&
          (pline("You sure are noisy."), (otmp->oprops & 0x4000) != 0)))) {
        pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      goto LAB_0014aede;
    }
    if (((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
       ((u.uprops[0x13].intrinsic == 0 &&
        ((u.uprops[0x13].blocked == 0 &&
         (pline("You move very quietly."), (otmp->oprops & 0x4000) != 0)))))) {
      pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    u.uprops[0x13].extrinsic = u.uprops[0x13].extrinsic | uVar11;
    bVar16 = true;
    if (!bVar17) goto LAB_0014af84;
  }
  if (bVar15) {
    if (!bVar13) {
      if (bVar16 == false) {
LAB_0014b0d1:
        u.uprops[0x14].extrinsic = ~uVar11 & u.uprops[0x14].extrinsic;
        bVar16 = false;
      }
      else {
LAB_0014b03a:
        u.uprops[0x14].extrinsic = uVar11 | u.uprops[0x14].extrinsic;
        bVar16 = true;
      }
    }
  }
  else if (bVar16 == false) {
    u.uprops[0x28].extrinsic = u.uprops[0x28].extrinsic & ~uVar11;
    if (!bVar13) goto LAB_0014b0d1;
    bVar16 = false;
  }
  else {
    u.uprops[0x28].extrinsic = u.uprops[0x28].extrinsic | uVar11;
    bVar16 = true;
    if (!bVar13) goto LAB_0014b03a;
  }
  if ((uVar6 >> 0xd & 1) == 0) {
    if ((uVar6 >> 0xe & 1) != 0) {
      if (bVar16 == false) {
LAB_0014b157:
        u.uprops[10].extrinsic = ~uVar11 & u.uprops[10].extrinsic;
        bVar16 = false;
      }
      else {
LAB_0014b12a:
        u.uprops[10].extrinsic = uVar11 | u.uprops[10].extrinsic;
        bVar16 = true;
      }
    }
  }
  else if (bVar16 == false) {
    u.uprops[0x2d].extrinsic = u.uprops[0x2d].extrinsic & ~uVar11;
    if ((uVar6 >> 0xe & 1) != 0) goto LAB_0014b157;
    bVar16 = false;
  }
  else {
    u.uprops[0x2d].extrinsic = u.uprops[0x2d].extrinsic | uVar11;
    bVar16 = true;
    if ((uVar6 >> 0xe & 1) != 0) goto LAB_0014b12a;
  }
  if ((uVar6 >> 0x12 & 1) != 0) {
    uVar7 = u.uprops[0xf].extrinsic | uVar11;
    u.uprops[0xf].extrinsic = ~uVar11 & u.uprops[0xf].extrinsic;
    if (bVar16 != false) {
      u.uprops[0xf].extrinsic = uVar7;
    }
  }
  if ((uVar8 & 0x20) != 0) {
    if (((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) ||
       (artilist[otmp->oartifact].mtype == 0)) {
      if (bVar16 == false) {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & ~uVar11;
      }
      else {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar11;
      }
    }
    else {
      uVar7 = (uint)artilist[otmp->oartifact].mtype;
      if (bVar16 == false) {
        u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & ~uVar11;
        flags.warntype = flags.warntype & ~uVar7;
      }
      else {
        u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar11;
        flags.warntype = flags.warntype | uVar7;
      }
    }
    see_monsters();
  }
  if ((uVar6 >> 0x1b & 1) != 0) {
    if (local_40->mtype == 0) {
      if (bVar16 == false) {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & ~uVar11;
      }
      else {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar11;
      }
    }
    else if (bVar16 == false) {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & ~uVar11;
    }
    else {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar11;
    }
    see_monsters();
  }
  if ((short)uVar8 < 0) {
    if (bVar16 != false) {
      u.uprops[0x30].extrinsic = u.uprops[0x30].extrinsic | uVar11;
      goto LAB_0014b29b;
    }
    u.uprops[0x30].extrinsic = u.uprops[0x30].extrinsic & ~uVar11;
    if ((uVar6 >> 0x10 & 1) != 0) {
LAB_0014b2d2:
      u.uprops[0x32].extrinsic = u.uprops[0x32].extrinsic & ~uVar11;
    }
    bVar16 = false;
LAB_0014b2e7:
    if ((uVar6 >> 0x11 & 1) == 0) goto LAB_0014b329;
    if (bVar16 == false) {
      u.uprops[0x33].extrinsic = ~uVar11 & u.uprops[0x33].extrinsic;
      bVar16 = false;
      goto LAB_0014b329;
    }
  }
  else {
LAB_0014b29b:
    if ((uVar6 >> 0x10 & 1) == 0) goto LAB_0014b2e7;
    if (bVar16 == false) goto LAB_0014b2d2;
    u.uprops[0x32].extrinsic = u.uprops[0x32].extrinsic | uVar11;
    bVar16 = true;
    if ((uVar6 >> 0x11 & 1) == 0) goto LAB_0014b329;
  }
  u.uprops[0x33].extrinsic = u.uprops[0x33].extrinsic | uVar11;
  bVar16 = true;
LAB_0014b329:
  if ((uVar6 >> 0x19 & 1) != 0) {
    u.xray_range = bVar16 - 1 | 3;
    vision_full_recalc = '\x01';
  }
  if (((wp_mask & 0x500U) != 0) && ((uVar8 & 0x4000000) != 0)) {
    if (bVar16 != false) {
      u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic | uVar11;
      return;
    }
    u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic & ~uVar11;
  }
  if ((((!bVar3 && bVar16 == false) && wp_mask == 0x1000) && ((byte)(local_40->inv_prop - 1) < 0x42)
      ) && ((u.uprops[local_40->inv_prop].extrinsic & 0x2000) != 0)) {
    arti_invoke(otmp);
    return;
  }
  return;
}

Assistant:

void set_artifact_intrinsic(struct obj *otmp, boolean on, long wp_mask,
			    boolean side_effects)
{
	unsigned int *mask = 0;
	const struct artifact *oart = get_artifact(otmp);
	uchar dtyp;
	long spfx;
	boolean spfx_stlth = FALSE;	/* we ran out of SPFX_* bits, so... */
	boolean spfx_fumbling = FALSE;
	boolean spfx_hunger = FALSE;
	boolean spfx_aggravate = FALSE;

	if (!oart && !otmp->oprops)
	    return;

	/* effects from the defn field */
	if (oart)
	    dtyp = (wp_mask != W_ART) ? oart->defn.adtyp : oart->cary.adtyp;
	else
	    dtyp = 0;

	if (dtyp == AD_FIRE)
	    mask = &EFire_resistance;
	else if (dtyp == AD_COLD)
	    mask = &ECold_resistance;
	else if (dtyp == AD_ELEC)
	    mask = &EShock_resistance;
	else if (dtyp == AD_MAGM)
	    mask = &EAntimagic;
	else if (dtyp == AD_DISN)
	    mask = &EDisint_resistance;
	else if (dtyp == AD_DRST)
	    mask = &EPoison_resistance;

	if (mask && wp_mask == W_ART && !on) {
	    /* find out if some other artifact also confers this intrinsic */
	    /* if so, leave the mask alone */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    if (art->cary.adtyp == dtyp ||
			(dtyp == AD_MAGM && is_quest_artifact(obj))) {
			mask = NULL;
			break;
		    }
		}
	}
	if (mask) {
	    if (on) *mask |= wp_mask;
	    else *mask &= ~wp_mask;
	}

	/* quest artifact grants magic resistance when carried by their role */
	if (is_quest_artifact(otmp) && wp_mask == W_ART) {
	    if (on) {
		EAntimagic |= W_ART;
	    } else {
		/* don't take away magic resistance if another artifact grants it */
		struct obj *obj;
		for (obj = invent; obj; obj = obj->nobj) {
		    if (obj != otmp && obj->oartifact) {
			const struct artifact *art = get_artifact(obj);
			if (art->cary.adtyp == AD_MAGM) break;
		    }
		}
		if (!obj) EAntimagic &= ~W_ART;
	    }
	}

	/* intrinsics from the spfx field; there could be more than one */
	spfx = 0;
	if (oart) {
	    spfx = (wp_mask != W_ART) ? oart->spfx : oart->cspfx;
	} else if ((wp_mask == W_WEP ||
		    (wp_mask == W_SWAPWEP && (u.twoweap || !on))) &&
		   (otmp->oclass == WEAPON_CLASS || is_weptool(otmp)) &&
		   !is_ammo(otmp) && !is_missile(otmp)) {
	    if (otmp->oprops & ITEM_REFLECTION)
		spfx |= SPFX_REFLECT;
	    if (otmp->oprops & ITEM_ESP)
		spfx |= SPFX_ESP;
	    if (otmp->oprops & ITEM_SEARCHING)
		spfx |= SPFX_SEARCH;
	    if (otmp->oprops & ITEM_WARNING)
		spfx |= SPFX_WARN;
	    if (otmp->oprops & ITEM_STEALTH)
		spfx_stlth = TRUE;
	    if (otmp->oprops & ITEM_FUMBLING)
		spfx_fumbling = TRUE;
	    if (otmp->oprops & ITEM_HUNGER)
		spfx_hunger = TRUE;
	    if (otmp->oprops & ITEM_AGGRAVATE)
		spfx_aggravate = TRUE;
	}

	if (spfx && wp_mask == W_ART && !on) {
	    /* don't change any spfx also conferred by other artifacts */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    spfx &= ~art->cspfx;
		}
	}

	if (spfx & SPFX_SEARCH) {
	    if (on) ESearching |= wp_mask;
	    else ESearching &= ~wp_mask;
	}
	if (spfx & SPFX_HALRES) {
	    /* make_hallucinated must (re)set the mask itself to get
	     * the display right */
	    /* hide message when restoring a game */
	    make_hallucinated((long)!on, side_effects, wp_mask);
	}
	if (spfx & SPFX_ESP) {
	    if (on) ETelepat |= wp_mask;
	    else ETelepat &= ~wp_mask;
	    see_monsters();
	}
	if (spfx_stlth) {
	    if (on) {
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You move very quietly.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
		EStealth |= wp_mask;
	    } else {
		EStealth &= ~wp_mask;
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You sure are noisy.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
	    }
	}
	if (spfx_fumbling) {
	    if (on) {
		if (!EFumbling && !(HFumbling & ~TIMEOUT))
		    incr_itimeout(&HFumbling, rnd(20));
		EFumbling |= wp_mask;
	    } else {
		EFumbling &= ~wp_mask;
		if (!EFumbling && ~(HFumbling & ~TIMEOUT))
		    HFumbling = EFumbling = 0;
	    }
	}
	if (spfx_hunger) {
	    if (on) EHunger |= wp_mask;
	    else EHunger &= ~wp_mask;
	}
	if (spfx_aggravate) {
	    if (on) EAggravate_monster |= wp_mask;
	    else EAggravate_monster &= ~wp_mask;
	}
	if (spfx & SPFX_DISPL) {
	    if (on) EDisplaced |= wp_mask;
	    else EDisplaced &= ~wp_mask;
	}
	if (spfx & SPFX_REGEN) {
	    if (on) ERegeneration |= wp_mask;
	    else ERegeneration &= ~wp_mask;
	}
	if (spfx & SPFX_TCTRL) {
	    if (on) ETeleport_control |= wp_mask;
	    else ETeleport_control &= ~wp_mask;
	}
	if (spfx & SPFX_WARN) {
	    if (spec_m2(otmp)) {
		if (on) {
			EWarn_of_mon |= wp_mask;
			flags.warntype |= spec_m2(otmp);
		} else {
			EWarn_of_mon &= ~wp_mask;
			flags.warntype &= ~spec_m2(otmp);
		}
	    } else {
		if (on) EWarning |= wp_mask;
		else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_WARN_S) {
	    if (oart->mtype) {
		if (on) {
		    EWarn_of_mon |= wp_mask;
		} else {
		    EWarn_of_mon &= ~wp_mask;
		}
	    } else {
		if (on) EWarning |= wp_mask;
	    	else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_EREGEN) {
	    if (on) EEnergy_regeneration |= wp_mask;
	    else EEnergy_regeneration &= ~wp_mask;
	}
	if (spfx & SPFX_HSPDAM) {
	    if (on) EHalf_spell_damage |= wp_mask;
	    else EHalf_spell_damage &= ~wp_mask;
	}
	if (spfx & SPFX_HPHDAM) {
	    if (on) EHalf_physical_damage |= wp_mask;
	    else EHalf_physical_damage &= ~wp_mask;
	}
	if (spfx & SPFX_XRAY) {
	    /* this assumes that no one else is using xray_range */
	    if (on) u.xray_range = 3;
	    else u.xray_range = -1;
	    vision_full_recalc = 1;
	}
	if ((spfx & SPFX_REFLECT) && (wp_mask & (W_WEP|W_SWAPWEP))) {
	    if (on) EReflecting |= wp_mask;
	    else EReflecting &= ~wp_mask;
	}

	if (wp_mask == W_ART && !on && oart && oart->inv_prop) {
	    /* might have to turn off invoked power too */
	    if (oart->inv_prop <= LAST_PROP &&
		(u.uprops[oart->inv_prop].extrinsic & W_ARTI))
		arti_invoke(otmp);
	}
}